

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O2

void __thiscall iqxmlrpc::anon_unknown_7::StructBuilder::~StructBuilder(StructBuilder *this)

{
  (this->super_ValueBuilderBase).super_BuilderBase._vptr_BuilderBase =
       (_func_int **)&PTR_do_visit_element_0019ed08;
  std::__cxx11::string::~string((string *)&this->name_);
  ValueBuilderBase::~ValueBuilderBase(&this->super_ValueBuilderBase);
  return;
}

Assistant:

StructBuilder(Parser& parser):
    ValueBuilderBase(parser),
    state_(parser, NONE),
    value_(0)
  {
    static const StateMachine::StateTransition trans[] = {
      { NONE, MEMBER, "member" },
      { MEMBER, NAME_READ, "name" },
      { NAME_READ, VALUE_READ, "value" },
      { 0, 0, 0 }
    };
    state_.set_transitions(trans);
    retval.reset(proxy_ = new Struct());
  }